

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_stl.hpp
# Opt level: O1

void chaiscript::bootstrap::standard_library::
     map_type<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>>
               (string *type,Module *m)

{
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  pointer pcVar1;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> sStack_108;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_f8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  Type_Info local_38;
  
  pcVar1 = (type->_M_dataplus)._M_p;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + type->_M_string_length);
  local_38.m_type_info =
       (type_info *)
       &std::
        map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>
        ::typeinfo;
  local_38.m_bare_type_info =
       (type_info *)
       &std::
        map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>
        ::typeinfo;
  local_38.m_flags = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,&local_38,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_38.m_type_info =
       (type_info *)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
       ::operator[];
  local_38.m_bare_type_info = (type_info *)0x0;
  dispatch::detail::
  make_callable_impl<chaiscript::Boxed_Value&(std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>::*)(std::__cxx11::string_const&),false,true,false,false,chaiscript::Boxed_Value&,std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>&,std::__cxx11::string_const&>
            (&local_e8);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"[]","");
  this = &m->m_funcs;
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_e8,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_e8.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_38.m_type_info =
       (type_info *)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
       ::at;
  local_38.m_bare_type_info = (type_info *)0x0;
  dispatch::detail::
  make_callable_impl<chaiscript::Boxed_Value&(std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>::*)(std::__cxx11::string_const&),false,true,false,false,chaiscript::Boxed_Value&,std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>&,std::__cxx11::string_const&>
            (&local_f8);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"at","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_f8,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_38.m_type_info =
       (type_info *)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
       ::at;
  local_38.m_bare_type_info = (type_info *)0x0;
  dispatch::detail::
  make_callable_impl<chaiscript::Boxed_Value_const&(std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>::*)(std::__cxx11::string_const&)const,false,true,false,false,chaiscript::Boxed_Value_const&,std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>const&,std::__cxx11::string_const&>
            (&sStack_108);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"at","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&sStack_108,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (sStack_108.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_108.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,
             "\n                    def Map::`==`(Map rhs) {\n                       if ( rhs.size() != this.size() ) {\n                         return false;\n                       } else {\n                         auto r1 = range(this);\n                         auto r2 = range(rhs);\n                         while (!r1.empty())\n                         {\n                           if (!eq(r1.front().first, r2.front().first) || !eq(r1.front().second, r2.front().second))\n                           {\n                             return false;\n                           }\n                           r1.pop_front();\n                           r2.pop_front();\n                         }\n                         true;\n                       }\n                   } "
             ,"");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&m->m_evals,
             &local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  container_type<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>>
            (type,m);
  default_constructible_type<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>>
            (type,m);
  copy_constructor<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>>
            (type,m);
  operators::
  assign<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>>
            (m);
  unique_associative_container_type<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>>
            (type,m);
  pair_associative_container_type<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>>
            (type,m);
  input_range_type<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>>
            (type,m);
  return;
}

Assistant:

void map_type(const std::string &type, Module &m) {
    m.add(user_type<MapType>(), type);

    using elem_access = typename MapType::mapped_type &(MapType::*)(const typename MapType::key_type &);
    using const_elem_access = const typename MapType::mapped_type &(MapType::*)(const typename MapType::key_type &) const;

    m.add(fun(static_cast<elem_access>(&MapType::operator[])), "[]");

    m.add(fun(static_cast<elem_access>(&MapType::at)), "at");
    m.add(fun(static_cast<const_elem_access>(&MapType::at)), "at");

    if (typeid(MapType) == typeid(std::map<std::string, Boxed_Value>)) {
      m.eval(R"(
                    def Map::`==`(Map rhs) {
                       if ( rhs.size() != this.size() ) {
                         return false;
                       } else {
                         auto r1 = range(this);
                         auto r2 = range(rhs);
                         while (!r1.empty())
                         {
                           if (!eq(r1.front().first, r2.front().first) || !eq(r1.front().second, r2.front().second))
                           {
                             return false;
                           }
                           r1.pop_front();
                           r2.pop_front();
                         }
                         true;
                       }
                   } )");
    }

    container_type<MapType>(type, m);
    default_constructible_type<MapType>(type, m);
    assignable_type<MapType>(type, m);
    unique_associative_container_type<MapType>(type, m);
    pair_associative_container_type<MapType>(type, m);
    input_range_type<MapType>(type, m);
  }